

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O0

econf_err key_file_append(econf_file *kf)

{
  ulong uVar1;
  file_entry *pfVar2;
  econf_file *kf_local;
  
  if (kf == (econf_file *)0x0) {
    kf_local._4_4_ = ECONF_ERROR;
  }
  else {
    uVar1 = kf->length;
    kf->length = uVar1 + 1;
    if (kf->alloc_length <= uVar1) {
      kf->alloc_length = kf->alloc_length + 1;
      pfVar2 = (file_entry *)realloc(kf->file_entry,kf->alloc_length * 0x38);
      kf->file_entry = pfVar2;
      if (kf->file_entry == (file_entry *)0x0) {
        return ECONF_NOMEM;
      }
      initialize(kf,kf->alloc_length - 1);
    }
    kf_local._4_4_ = ECONF_SUCCESS;
  }
  return kf_local._4_4_;
}

Assistant:

econf_err key_file_append(econf_file *kf) {
  if (kf == NULL)
    return ECONF_ERROR;
  if(kf->length++ >= kf->alloc_length) {
    kf->alloc_length++;
    kf->file_entry =
      realloc(kf->file_entry, (kf->alloc_length) * sizeof(struct file_entry));
    if (kf->file_entry == NULL)
      return ECONF_NOMEM;
    initialize(kf, kf->alloc_length - 1);
  }
  return ECONF_SUCCESS;
}